

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O3

Ivy_Store_t * Ivy_NodeFindCutsAll(Ivy_Man_t *p,Ivy_Obj_t *pObj,int nLeaves)

{
  int IdOld;
  int iVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  int *piVar5;
  ushort uVar6;
  int IdNew0;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  Ivy_Cut_t local_54;
  
  if (6 < nLeaves) {
    __assert_fail("nLeaves <= IVY_CUT_INPUT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,899,"Ivy_Store_t *Ivy_NodeFindCutsAll(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  Ivy_NodeFindCutsAll::CutStore.nCuts = 0;
  Ivy_NodeFindCutsAll::CutStore.nCutsMax = 0x100;
  local_54.nSize = 1;
  local_54.nSizeMax = (short)nLeaves;
  local_54.pArray[0] = pObj->Id;
  iVar10 = 1;
  local_54.uHash =
       1 << ((char)(local_54.pArray[0] / 0x1f) * -0x1f + (char)local_54.pArray[0] & 0x1fU);
  Ivy_NodeCutFindOrAdd(&Ivy_NodeFindCutsAll::CutStore,&local_54);
  if (Ivy_NodeFindCutsAll::CutStore.nCuts != 1) {
    __assert_fail("pCutStore->nCuts == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,0x390,"Ivy_Store_t *Ivy_NodeFindCutsAll(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  lVar11 = 0xe2cf28;
  lVar7 = 0;
  do {
    uVar6 = Ivy_NodeFindCutsAll::CutStore.pCuts[lVar7].nSize;
    if (uVar6 != 0) {
      if (0 < (short)uVar6) {
        lVar12 = 0;
        do {
          IdOld = *(int *)(lVar7 * 0x24 + 0xe2cf28 + lVar12 * 4);
          if (((long)IdOld < 0) || (p->vObjs->nSize <= IdOld)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar3 = p->vObjs->pArray[IdOld];
          uVar4 = *(uint *)((long)pvVar3 + 8) & 0xf;
          if ((uVar4 != 1) && (uVar4 != 4)) {
            uVar9 = *(ulong *)((long)pvVar3 + 0x10);
            while (piVar5 = (int *)(uVar9 & 0xfffffffffffffffe), (piVar5[2] & 0xfU) == 7) {
              uVar9 = *(ulong *)(piVar5 + 4);
            }
            uVar9 = *(ulong *)((long)pvVar3 + 0x18);
            while (piVar8 = (int *)(uVar9 & 0xfffffffffffffffe), (piVar8[2] & 0xfU) == 7) {
              uVar9 = *(ulong *)(piVar8 + 4);
            }
            IdNew0 = *piVar5;
            iVar1 = *piVar8;
            if ((short)uVar6 < Ivy_NodeFindCutsAll::CutStore.pCuts[lVar7].nSizeMax) {
LAB_00918a31:
              iVar10 = iVar1;
              if (iVar1 < IdNew0) {
                iVar10 = IdNew0;
                IdNew0 = iVar1;
              }
              Ivy_NodeCutDeriveNew
                        (Ivy_NodeFindCutsAll::CutStore.pCuts + lVar7,&local_54,IdOld,IdNew0,iVar10);
              Ivy_NodeCutFindOrAddFilter(&Ivy_NodeFindCutsAll::CutStore,&local_54);
              if (Ivy_NodeFindCutsAll::CutStore.nCuts == 0x100) goto LAB_00918abf;
              uVar6 = Ivy_NodeFindCutsAll::CutStore.pCuts[lVar7].nSize;
              iVar10 = Ivy_NodeFindCutsAll::CutStore.nCuts;
            }
            else {
              uVar9 = 0;
              do {
                iVar2 = *(int *)(lVar11 + uVar9 * 4);
                if ((iVar2 == IdNew0) || (iVar2 == iVar1)) goto LAB_00918a31;
                uVar9 = uVar9 + 1;
              } while (uVar6 != uVar9);
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < (short)uVar6);
      }
      if (iVar10 == 0x100) break;
    }
    lVar7 = lVar7 + 1;
    lVar11 = lVar11 + 0x24;
  } while (lVar7 < iVar10);
LAB_00918abf:
  Ivy_NodeCompactCuts(&Ivy_NodeFindCutsAll::CutStore);
  return &Ivy_NodeFindCutsAll::CutStore;
}

Assistant:

Ivy_Store_t * Ivy_NodeFindCutsAll( Ivy_Man_t * p, Ivy_Obj_t * pObj, int nLeaves )
{
    static Ivy_Store_t CutStore, * pCutStore = &CutStore;
    Ivy_Cut_t CutNew, * pCutNew = &CutNew, * pCut;
    Ivy_Obj_t * pLeaf;
    int i, k, iLeaf0, iLeaf1;

    assert( nLeaves <= IVY_CUT_INPUT );

    // start the structure
    pCutStore->nCuts = 0;
    pCutStore->nCutsMax = IVY_CUT_LIMIT;
    // start the trivial cut
    pCutNew->uHash = 0;
    pCutNew->nSize = 1;
    pCutNew->nSizeMax = nLeaves;
    pCutNew->pArray[0] = pObj->Id;
    Ivy_NodeCutHash( pCutNew );
    // add the trivial cut
    Ivy_NodeCutFindOrAdd( pCutStore, pCutNew );
    assert( pCutStore->nCuts == 1 );

    // explore the cuts
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        // expand this cut
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        for ( k = 0; k < pCut->nSize; k++ )
        {
            pLeaf = Ivy_ManObj( p, pCut->pArray[k] );
            if ( Ivy_ObjIsCi(pLeaf) )
                continue;
/*
            *pCutNew = *pCut;
            Ivy_NodeCutShrink( pCutNew, pLeaf->Id );
            if ( !Ivy_NodeCutExtend( pCutNew, Ivy_ObjFaninId0(pLeaf) ) )
                continue;
            if ( Ivy_ObjIsNode(pLeaf) && !Ivy_NodeCutExtend( pCutNew, Ivy_ObjFaninId1(pLeaf) ) )
                continue;
            Ivy_NodeCutHash( pCutNew );
*/
            iLeaf0 = Ivy_ObjId( Ivy_ObjRealFanin(Ivy_ObjFanin0(pLeaf)) );
            iLeaf1 = Ivy_ObjId( Ivy_ObjRealFanin(Ivy_ObjFanin1(pLeaf)) );
//            if ( iLeaf0 == iLeaf1 ) // strange situation observed on Jan 18, 2007
//                continue;
            if ( !Ivy_NodeCutPrescreen( pCut, iLeaf0, iLeaf1 ) )
                continue;
            if ( iLeaf0 > iLeaf1 )
                Ivy_NodeCutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf1, iLeaf0 );
            else
                Ivy_NodeCutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf0, iLeaf1 );
            Ivy_NodeCutFindOrAddFilter( pCutStore, pCutNew );
            if ( pCutStore->nCuts == IVY_CUT_LIMIT )
                break;
        }
        if ( pCutStore->nCuts == IVY_CUT_LIMIT )
            break;
    }
    Ivy_NodeCompactCuts( pCutStore );
//    Ivy_NodePrintCuts( pCutStore );
    return pCutStore;
}